

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_types.hpp
# Opt level: O3

void __thiscall libtorrent::peer_connect_alert::~peer_connect_alert(peer_connect_alert *this)

{
  _Atomic_word *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  int iVar3;
  
  (this->super_peer_alert).super_torrent_alert.super_alert._vptr_alert =
       (_func_int **)&PTR__torrent_alert_004dc350;
  p_Var2 = (this->super_peer_alert).super_torrent_alert.handle.m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &p_Var2->_M_weak_count;
      iVar3 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar3 = p_Var2->_M_weak_count;
      p_Var2->_M_weak_count = iVar3 + -1;
    }
    if (iVar3 == 1) {
      (*p_Var2->_vptr__Sp_counted_base[3])();
    }
  }
  operator_delete(this,0x68);
  return;
}

Assistant:

struct TORRENT_EXPORT peer_connect_alert final : peer_alert
	{
		enum class direction_t { in, out };

		// internal
		TORRENT_UNEXPORT peer_connect_alert(aux::stack_allocator& alloc, torrent_handle h
			, tcp::endpoint const& ep, peer_id const& peer_id, socket_type_t type, direction_t direction);

		TORRENT_DEFINE_ALERT(peer_connect_alert, 23)

		static inline constexpr alert_category_t static_category = alert_category::connect;
		std::string message() const override;

		// Tells you if the peer was incoming or outgoing
		direction_t direction;

		socket_type_t socket_type;
	}